

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall
cmMakefile::GetConfigurations
          (string *__return_storage_ptr__,cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,bool singleConfig)

{
  int iVar1;
  char *pcVar2;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  
  iVar1 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x1d])();
  if ((char)iVar1 == '\0') {
    std::__cxx11::string::string((string *)&local_40,"CMAKE_BUILD_TYPE",&local_61);
    pcVar2 = GetSafeDefinition(this,&local_40);
    std::__cxx11::string::string((string *)&local_60,pcVar2,&local_62);
    std::__cxx11::string::~string((string *)&local_40);
    if ((singleConfig) && (local_60._M_string_length != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(configs,&local_60);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_60,"CMAKE_CONFIGURATION_TYPES",(allocator *)&local_40);
    pcVar2 = GetDefinition(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_60,pcVar2,(allocator *)&local_40);
      cmSystemTools::ExpandListArgument(&local_60,configs,false);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmMakefile::GetConfigurations(std::vector<std::string>& configs,
                              bool singleConfig) const
{
  if(this->GetGlobalGenerator()->IsMultiConfig())
    {
    if(const char* configTypes =
       this->GetDefinition("CMAKE_CONFIGURATION_TYPES"))
      {
      cmSystemTools::ExpandListArgument(configTypes, configs);
      }
    return "";
    }
  else
    {
    const std::string& buildType = this->GetSafeDefinition("CMAKE_BUILD_TYPE");
    if(singleConfig && !buildType.empty())
      {
      configs.push_back(buildType);
      }
    return buildType;
    }
}